

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O1

void __thiscall minja::Value::dump(Value *this,ostringstream *out,int indent,int level,bool to_json)

{
  value_t vVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  bool bVar5;
  ostream *poVar6;
  runtime_error *this_00;
  ulong uVar7;
  int iVar8;
  Value *pVVar9;
  char *pcVar10;
  undefined7 in_register_00000081;
  int iVar11;
  pointer this_01;
  char cVar12;
  uint uVar13;
  int n;
  int n_1;
  char local_85;
  uint local_84;
  string_t local_80;
  uint local_5c;
  pointer local_58;
  Value *local_50;
  int local_44;
  ulong local_40;
  uint local_34;
  
  local_40 = (ulong)(uint)level;
  peVar2 = (this->array_).
           super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar3 = (this->object_).
           super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  vVar1 = (this->primitive_).m_data.m_type;
  peVar4 = (this->callable_).
           super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar4 == (element_type *)0x0 &&
      (vVar1 == null && (peVar3 == (element_type *)0x0 && peVar2 == (element_type *)0x0))) {
    pcVar10 = "null";
    uVar7 = 4;
LAB_001bdf21:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,pcVar10,uVar7);
    return;
  }
  local_50 = this;
  if (peVar2 == (element_type *)0x0) {
    local_84 = (uint)((int)CONCAT71(in_register_00000081,to_json) == 0) * 5 + 0x22;
    if (peVar3 == (element_type *)0x0) {
      if (peVar4 != (element_type *)0x0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Cannot dump callable to JSON");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (vVar1 != boolean || to_json) {
        if (vVar1 == string && !to_json) {
          dump_string(&this->primitive_,out,(char)local_84);
          return;
        }
        nlohmann::json_abi_v3_11_3::
        basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::dump(&local_80,&this->primitive_,-1,' ',false,strict);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)out,
                   (char *)CONCAT71(local_80._M_dataplus._M_p._1_7_,(char)local_80._M_dataplus._M_p)
                   ,local_80._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_80._M_dataplus._M_p._1_7_,(char)local_80._M_dataplus._M_p) ==
            &local_80.field_2) {
          return;
        }
        operator_delete((undefined1 *)
                        CONCAT71(local_80._M_dataplus._M_p._1_7_,(char)local_80._M_dataplus._M_p),
                        local_80.field_2._M_allocated_capacity + 1);
        return;
      }
      bVar5 = to_bool(this);
      pcVar10 = "False";
      if (bVar5) {
        pcVar10 = "True";
      }
      uVar7 = (ulong)bVar5 ^ 5;
      goto LAB_001bdf21;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"{",1);
    iVar11 = level + 1;
    if (0 < indent) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\n",1);
      iVar8 = iVar11 * indent;
      if (0 < iVar8) {
        do {
          local_80._M_dataplus._M_p._0_1_ = ' ';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,(char *)&local_80,1);
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
    }
    peVar3 = (local_50->object_).
             super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    this_01 = (peVar3->
              super_vector<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>
              ).
              super__Vector_base<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_58 = this_01;
    if (this_01 !=
        (peVar3->
        super_vector<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>
        ).
        super__Vector_base<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_44 = iVar11 * indent;
      local_34 = local_84 & 0xff;
      local_5c = (uint)to_json;
      do {
        if (this_01 != local_58) {
          local_80._M_dataplus._M_p._0_1_ = ',';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,(char *)&local_80,1);
          if (indent < 0) {
            local_80._M_dataplus._M_p._0_1_ = ' ';
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,(char *)&local_80,1);
          }
          else if ((0 < indent) &&
                  (std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\n",1),
                  iVar8 = local_44, 0 < local_44)) {
            do {
              local_80._M_dataplus._M_p._0_1_ = ' ';
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,(char *)&local_80,1)
              ;
              iVar8 = iVar8 + -1;
            } while (iVar8 != 0);
          }
        }
        if ((this_01->first).m_data.m_type == string) {
          dump_string(&this_01->first,out,(char)local_34);
          pVVar9 = local_50;
        }
        else {
          cVar12 = (char)local_84;
          local_80._M_dataplus._M_p._0_1_ = cVar12;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)out,(char *)&local_80,1);
          nlohmann::json_abi_v3_11_3::
          basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::dump(&local_80,&this_01->first,-1,' ',false,strict);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(char *)CONCAT71(local_80._M_dataplus._M_p._1_7_,
                                                      (char)local_80._M_dataplus._M_p),
                              local_80._M_string_length);
          local_85 = cVar12;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_85,1);
          pVVar9 = local_50;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_80._M_dataplus._M_p._1_7_,(char)local_80._M_dataplus._M_p) !=
              &local_80.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_80._M_dataplus._M_p._1_7_,(char)local_80._M_dataplus._M_p
                                    ),local_80.field_2._M_allocated_capacity + 1);
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,": ",2);
        dump(&this_01->second,out,indent,iVar11,SUB41(local_5c,0));
        this_01 = this_01 + 1;
      } while (this_01 !=
               (((pVVar9->object_).
                 super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->
               super_vector<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>
               ).
               super__Vector_base<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    uVar7 = local_40;
    if (0 < indent) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\n",1);
      iVar11 = (int)uVar7 * indent;
      if (0 < iVar11) {
        do {
          local_80._M_dataplus._M_p._0_1_ = ' ';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,(char *)&local_80,1);
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
    }
    pcVar10 = "}";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"[",1);
    local_58 = (pointer)CONCAT44(local_58._4_4_,level + 1);
    if (0 < indent) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\n",1);
      iVar11 = (int)local_58 * indent;
      if (0 < iVar11) {
        do {
          local_80._M_dataplus._M_p._0_1_ = ' ';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,(char *)&local_80,1);
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
    }
    pVVar9 = local_50;
    peVar2 = (local_50->array_).
             super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if ((peVar2->super__Vector_base<minja::Value,_std::allocator<minja::Value>_>)._M_impl.
        super__Vector_impl_data._M_finish !=
        (peVar2->super__Vector_base<minja::Value,_std::allocator<minja::Value>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      local_84 = (int)local_58 * indent;
      uVar7 = 0;
      local_5c = (uint)to_json;
      do {
        if (uVar7 != 0) {
          local_80._M_dataplus._M_p._0_1_ = ',';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,(char *)&local_80,1);
          if (indent < 0) {
            local_80._M_dataplus._M_p._0_1_ = ' ';
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,(char *)&local_80,1);
          }
          else if ((0 < indent) &&
                  (std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\n",1),
                  uVar13 = local_84, 0 < (int)local_84)) {
            do {
              local_80._M_dataplus._M_p._0_1_ = ' ';
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,(char *)&local_80,1)
              ;
              uVar13 = uVar13 - 1;
            } while (uVar13 != 0);
          }
        }
        dump((((pVVar9->array_).
               super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super__Vector_base<minja::Value,_std::allocator<minja::Value>_>)._M_impl.
             super__Vector_impl_data._M_start + uVar7,out,indent,(int)local_58,SUB41(local_5c,0));
        peVar2 = (pVVar9->array_).
                 super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        uVar7 = uVar7 + 1;
      } while (uVar7 < (ulong)(((long)(peVar2->
                                      super__Vector_base<minja::Value,_std::allocator<minja::Value>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(peVar2->
                                      super__Vector_base<minja::Value,_std::allocator<minja::Value>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 4) *
                              -0x3333333333333333));
    }
    uVar7 = local_40;
    if (0 < indent) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\n",1);
      iVar11 = (int)uVar7 * indent;
      if (0 < iVar11) {
        do {
          local_80._M_dataplus._M_p._0_1_ = ' ';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,(char *)&local_80,1);
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
    }
    pcVar10 = "]";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,pcVar10,1);
  return;
}

Assistant:

void dump(std::ostringstream & out, int indent = -1, int level = 0, bool to_json = false) const {
    auto print_indent = [&](int level) {
      if (indent > 0) {
          out << "\n";
          for (int i = 0, n = level * indent; i < n; ++i) out << ' ';
      }
    };
    auto print_sub_sep = [&]() {
      out << ',';
      if (indent < 0) out << ' ';
      else print_indent(level + 1);
    };

    auto string_quote = to_json ? '"' : '\'';

    if (is_null()) out << "null";
    else if (array_) {
      out << "[";
      print_indent(level + 1);
      for (size_t i = 0; i < array_->size(); ++i) {
        if (i) print_sub_sep();
        (*array_)[i].dump(out, indent, level + 1, to_json);
      }
      print_indent(level);
      out << "]";
    } else if (object_) {
      out << "{";
      print_indent(level + 1);
      for (auto begin = object_->begin(), it = begin; it != object_->end(); ++it) {
        if (it != begin) print_sub_sep();
        if (it->first.is_string()) {
          dump_string(it->first, out, string_quote);
        } else {
          out << string_quote << it->first.dump() << string_quote;
        }
        out << ": ";
        it->second.dump(out, indent, level + 1, to_json);
      }
      print_indent(level);
      out << "}";
    } else if (callable_) {
      throw std::runtime_error("Cannot dump callable to JSON");
    } else if (is_boolean() && !to_json) {
      out << (this->to_bool() ? "True" : "False");
    } else if (is_string() && !to_json) {
      dump_string(primitive_, out, string_quote);
    } else {
      out << primitive_.dump();
    }
  }